

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.cpp
# Opt level: O1

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_25(void)

{
  return;
}

Assistant:

~single () = default;